

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

void __thiscall
QHttp2ProtocolHandler::_q_uploadDataDestroyed(QHttp2ProtocolHandler *this,QObject *uploadData)

{
  bool bVar1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_28;
  QObject *uploadData_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  uploadData_local = uploadData;
  QHash<QObject*,QPointer<QHttp2Stream>>::takeImpl<QObject*>
            ((QHash<QObject*,QPointer<QHttp2Stream>> *)&local_28,(QObject **)(this + 0x48));
  bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_28);
  if (bVar1) {
    if ((*(int *)(local_28.value + 0x68) != 0) && (*(int *)(local_28.value + 0x68) != 5)) {
      QHttp2Stream::sendRST_STREAM((QHttp2Stream *)local_28.value,CANCEL);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::_q_uploadDataDestroyed(QObject *uploadData)
{
    QPointer<QHttp2Stream> stream = streamIDs.take(uploadData);
    if (stream && stream->isActive())
        stream->sendRST_STREAM(CANCEL);
}